

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O3

void sysbvm_dictionary_add
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t association)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int64_t svalue;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  anon_struct_32_4_053a9f48 gcFrame;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  sysbvm_dictionary_t *local_68;
  sysbvm_tuple_t local_60;
  ulong local_58;
  ulong local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if ((dictionary & 0xf) == 0 && dictionary != 0) {
    local_30 = (undefined1 *)&local_68;
    sVar4 = 0;
    local_60 = 0;
    local_50 = 0;
    local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_48._12_4_ = 0;
    local_38 = 4;
    local_68 = (sysbvm_dictionary_t *)dictionary;
    local_58 = association;
    sysbvm_stackFrame_pushRecord(&local_48);
    if ((local_58 & 0xf) == 0 && local_58 != 0) {
      if (*(uint *)(local_58 + 0xc) < 8) {
        sVar4 = 0;
      }
      else {
        sVar4 = *(sysbvm_tuple_t *)(local_58 + 0x10);
      }
    }
    local_60 = sVar4;
    lVar2 = sysbvm_dictionary_scanFor(context,&local_68,&local_60);
    if (lVar2 < 0) {
      sysbvm_dictionary_increaseCapacity(context,&local_68);
      lVar2 = sysbvm_dictionary_scanFor(context,&local_68,&local_60);
      if (lVar2 < 0) {
        sysbvm_error("Dictionary out of memory.");
      }
    }
    local_50 = *(ulong *)(local_68->storage + 0x10 + lVar2 * 8);
    if (local_50 == 0) {
      *(ulong *)(local_68->storage + 0x10 + lVar2 * 8) = local_58;
      uVar5 = local_68->storage;
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        uVar5 = (ulong)(*(uint *)(uVar5 + 0xc) >> 1 & 0xfffffffc) / 5;
      }
      else {
        uVar5 = 0;
      }
      uVar1 = local_68->size;
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        lVar2 = (long)uVar1 >> 4;
      }
      else {
        lVar2 = *(long *)(uVar1 + 0x10);
      }
      uVar1 = lVar2 + 1;
      if (lVar2 + 0x800000000000001U >> 0x3c == 0) {
        uVar3 = uVar1 * 0x10 | 0xb;
      }
      else {
        uVar3 = sysbvm_tuple_uint64_encodeBig(context,uVar1);
      }
      local_68->size = uVar3;
      if (uVar5 <= uVar1) {
        sysbvm_dictionary_increaseCapacity(context,&local_68);
      }
    }
    else {
      local_50 = local_58;
    }
    sysbvm_stackFrame_popRecord(&local_48);
  }
  return;
}

Assistant:

SYSBVM_INLINE bool sysbvm_tuple_isNonNullPointer(sysbvm_tuple_t tuple)
{
    return (tuple != 0) & ((tuple & SYSBVM_TUPLE_TAG_BIT_MASK) == SYSBVM_TUPLE_TAG_POINTER);
}